

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O1

void __thiscall
MADPComponentDiscreteActions::MADPComponentDiscreteActions
          (MADPComponentDiscreteActions *this,MADPComponentDiscreteActions *a)

{
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
  *this_00;
  size_t *psVar1;
  JointActionDiscrete *this_01;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  *pmVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  uint uVar5;
  pointer ppJVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [32];
  JointActionDiscrete *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  this->_vptr_MADPComponentDiscreteActions =
       (_func_int **)&PTR__MADPComponentDiscreteActions_005da1b8;
  (this->_m_jointActionVec).
  super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_jointActionVec).
  super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_jointActionVec).
  super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar10 = ZEXT432(0) << 0x40;
  this->_m_nrActions = (vector<unsigned_long,_std::allocator<unsigned_long>_>)auVar10._0_24_;
  (this->_m_actionVecs).
  super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar10._24_8_;
  *(undefined1 (*) [32])
   &(this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = auVar10;
  this->_m_initialized = a->_m_initialized;
  this->_m_cachedAllJointActions = a->_m_cachedAllJointActions;
  this->_m_jointIndicesValid = a->_m_jointIndicesValid;
  this->_m_nrJointActions = a->_m_nrJointActions;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->_m_nrActions,&a->_m_nrActions);
  psVar1 = IndexTools::CalculateStepSize(&this->_m_nrActions);
  this->_m_actionStepSize = psVar1;
  std::
  vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
  ::operator=(&this->_m_actionVecs,&a->_m_actionVecs);
  ppJVar6 = (this->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_jointActionVec).
      super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppJVar6) {
    (this->_m_jointActionVec).
    super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppJVar6;
  }
  ppJVar6 = (a->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(a->_m_jointActionVec).
                super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppJVar6;
  if (lVar7 != 0) {
    uVar8 = lVar7 >> 3;
    uVar5 = 1;
    uVar9 = 0;
    do {
      this_01 = (JointActionDiscrete *)operator_new(0x48);
      if (uVar8 <= uVar9) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9
                   ,uVar8);
      }
      JointActionDiscrete::JointActionDiscrete(this_01,ppJVar6[uVar9]);
      local_40 = this_01;
      std::vector<JointActionDiscrete*,std::allocator<JointActionDiscrete*>>::
      emplace_back<JointActionDiscrete*>
                ((vector<JointActionDiscrete*,std::allocator<JointActionDiscrete*>> *)
                 &this->_m_jointActionVec,&local_40);
      uVar9 = (ulong)uVar5;
      ppJVar6 = (a->_m_jointActionVec).
                super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(a->_m_jointActionVec).
                    super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar6 >> 3;
      uVar5 = uVar5 + 1;
    } while (uVar8 != uVar9);
  }
  pmVar2 = (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
            *)operator_new(0x30);
  p_Var4 = &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
  (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(pmVar2->_M_t)._M_impl = 0;
  *(undefined8 *)&(pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_m_jointActionIndices = pmVar2;
  if ((a->_m_jointActionIndices !=
       (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
        *)0x0) &&
     (p_Var3 = (a->_m_jointActionIndices->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
     (_Rb_tree_header *)p_Var3 != &(a->_m_jointActionIndices->_M_t)._M_impl.super__Rb_tree_header))
  {
    do {
      this_00 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
                 *)this->_m_jointActionIndices;
      this_02 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (this_02,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Var3[1]._M_parent)
      ;
      local_40 = (JointActionDiscrete *)CONCAT44(local_40._4_4_,p_Var3[1]._M_color);
      local_38 = this_02;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
      ::
      _M_emplace_unique<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                (this_00,(pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>
                          *)&local_40);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 !=
             &(a->_m_jointActionIndices->_M_t)._M_impl.super__Rb_tree_header);
  }
  return;
}

Assistant:

MADPComponentDiscreteActions::MADPComponentDiscreteActions(
    const MADPComponentDiscreteActions& a)
{
    _m_initialized=a._m_initialized;
    _m_cachedAllJointActions=a._m_cachedAllJointActions;
    _m_jointIndicesValid=a._m_jointIndicesValid;
    _m_nrJointActions=a._m_nrJointActions;
    _m_nrActions=a._m_nrActions;
    _m_actionStepSize=IndexTools::CalculateStepSize(_m_nrActions);
    _m_actionVecs=a._m_actionVecs;

    _m_jointActionVec.clear();
    for(Index ja=0;ja!=a._m_jointActionVec.size();++ja)
        _m_jointActionVec.push_back(new JointActionDiscrete(*a._m_jointActionVec.at(ja)));

    _m_jointActionIndices=new map<Index, vector<Index> *>();
    if(a._m_jointActionIndices)
    {
        map<Index, vector<Index> *>::const_iterator iter;
        for(iter = a._m_jointActionIndices->begin();
            iter != a._m_jointActionIndices->end();
            ++iter)
            _m_jointActionIndices->insert(make_pair( iter->first, new vector<Index>(*iter->second ))); 
    }
}